

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocess.cpp
# Opt level: O0

int main(void)

{
  test_location<void_(*)()> test;
  test_location<void_(*)()> test_00;
  test_location<void_(*)()> test_01;
  test_location<void_(*)()> test_02;
  test_location<void_(*)()> test_03;
  source_location sVar1;
  test local_270;
  char *local_238;
  int local_230;
  source_location local_228;
  anon_class_1_0_00000001 local_211;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  test local_1f8;
  char *local_1c0;
  int local_1b8;
  source_location local_1b0;
  anon_class_1_0_00000001 local_199;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  test local_180;
  char *local_148;
  int local_140;
  source_location local_138;
  anon_class_1_0_00000001 local_121;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  test local_108;
  char *local_d0;
  int local_c8;
  source_location local_c0;
  anon_class_1_0_00000001 local_a9;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  test local_80;
  char *local_48;
  int local_40;
  source_location local_38;
  anon_class_1_0_00000001 local_21;
  undefined8 local_20;
  undefined8 uStack_18;
  undefined8 local_10;
  
  sVar1 = boost::ext::ut::v1_1_8::reflection::source_location::current
                    ("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/preprocess.cpp"
                     ,0x30);
  local_48 = sVar1.file_;
  local_40 = sVar1.line_;
  local_38.file_ = local_48;
  local_38.line_ = local_40;
  boost::ext::ut::v1_1_8::detail::test_location<void(*)()>::test_location<main::__0>
            ((test_location<void(*)()> *)&local_20,&local_21,&local_38);
  boost::ext::ut::v1_1_8::literals::operator____test(&local_80,"test_bqp_clean",0xe);
  test.location.file_ = (char *)uStack_18;
  test.test = (_func_void *)local_20;
  test.location._8_8_ = local_10;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_80,test);
  boost::ext::ut::v1_1_8::detail::test::~test(&local_80);
  sVar1 = boost::ext::ut::v1_1_8::reflection::source_location::current
                    ("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/preprocess.cpp"
                     ,0xc3);
  local_d0 = sVar1.file_;
  local_c8 = sVar1.line_;
  local_c0.file_ = local_d0;
  local_c0.line_ = local_c8;
  boost::ext::ut::v1_1_8::detail::test_location<void(*)()>::test_location<main::__1>
            ((test_location<void(*)()> *)&local_a8,&local_a9,&local_c0);
  boost::ext::ut::v1_1_8::literals::operator____test(&local_108,"test_bound_affectation",0x16);
  test_00.location.file_ = (char *)uStack_a0;
  test_00.test = (_func_void *)local_a8;
  test_00.location._8_8_ = local_98;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_108,test_00);
  boost::ext::ut::v1_1_8::detail::test::~test(&local_108);
  sVar1 = boost::ext::ut::v1_1_8::reflection::source_location::current
                    ("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/preprocess.cpp"
                     ,0xec);
  local_148 = sVar1.file_;
  local_140 = sVar1.line_;
  local_138.file_ = local_148;
  local_138.line_ = local_140;
  boost::ext::ut::v1_1_8::detail::test_location<void(*)()>::test_location<main::__2>
            ((test_location<void(*)()> *)&local_120,&local_121,&local_138);
  boost::ext::ut::v1_1_8::literals::operator____test
            (&local_180,"test_cleaning_affected_variables",0x20);
  test_01.location.file_ = (char *)uStack_118;
  test_01.test = (_func_void *)local_120;
  test_01.location._8_8_ = local_110;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_180,test_01);
  boost::ext::ut::v1_1_8::detail::test::~test(&local_180);
  sVar1 = boost::ext::ut::v1_1_8::reflection::source_location::current
                    ("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/preprocess.cpp"
                     ,0xf9);
  local_1c0 = sVar1.file_;
  local_1b8 = sVar1.line_;
  local_1b0.file_ = local_1c0;
  local_1b0.line_ = local_1b8;
  boost::ext::ut::v1_1_8::detail::test_location<void(*)()>::test_location<main::__3>
            ((test_location<void(*)()> *)&local_198,&local_199,&local_1b0);
  boost::ext::ut::v1_1_8::literals::operator____test(&local_1f8,"test_affect_variable",0x14);
  test_02.location.file_ = (char *)uStack_190;
  test_02.test = (_func_void *)local_198;
  test_02.location._8_8_ = local_188;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_1f8,test_02);
  boost::ext::ut::v1_1_8::detail::test::~test(&local_1f8);
  sVar1 = boost::ext::ut::v1_1_8::reflection::source_location::current
                    ("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/preprocess.cpp"
                     ,300);
  local_238 = sVar1.file_;
  local_230 = sVar1.line_;
  local_228.file_ = local_238;
  local_228.line_ = local_230;
  boost::ext::ut::v1_1_8::detail::test_location<void(*)()>::test_location<main::__4>
            ((test_location<void(*)()> *)&local_210,&local_211,&local_228);
  boost::ext::ut::v1_1_8::literals::operator____test(&local_270,"test_split",10);
  test_03.location.file_ = (char *)uStack_208;
  test_03.test = (_func_void *)local_210;
  test_03.location._8_8_ = local_200;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_270,test_03);
  boost::ext::ut::v1_1_8::detail::test::~test(&local_270);
  return 0;
}

Assistant:

int
main()
{
    using namespace boost::ut;

    "test_bqp_clean"_test = [] {
        auto ctx = baryonyx::make_context(4);

        {
            const char* str_pb = "minimize\n"
                                 "-5a + [ 2a * b + 6c * d ] /2 + 10b\n"
                                 "Subject to:\n"
                                 "- a + b >= 0\n"
                                 "b + c - d >= 0\n"
                                 "Binaries\n"
                                 "a b c d\n"
                                 "End\n";

            std::istringstream iss(str_pb);
            auto pb = baryonyx::make_problem(*ctx, iss);
            expect(pb);

            auto pb_pp = baryonyx::preprocess(*ctx, pb);

            expect(pb_pp.vars.names.size() == 4u);
            expect(pb_pp.affected_vars.names.size() == 0u);
            expect(pb_pp.equal_constraints.size() == 0u);
            expect(pb_pp.less_constraints.size() == 0u);
            expect(pb_pp.greater_constraints.size() == 2u);

            auto ida = get_variable(pb.vars.names, "a");
            auto idb = get_variable(pb.vars.names, "b");
            auto idc = get_variable(pb.vars.names, "c");
            auto idd = get_variable(pb.vars.names, "d");

            expect(ida >= 0 && ida < baryonyx::length(pb.vars.names));
            expect(idb >= 0 && idb < baryonyx::length(pb.vars.names));
            expect(idc >= 0 && idc < baryonyx::length(pb.vars.names));
            expect(idd >= 0 && idd < baryonyx::length(pb.vars.names));

            expect(pb_pp.objective.elements.size() == 2u);
            expect(pb_pp.objective.elements[0].variable_index == ida);
            expect(pb_pp.objective.elements[0].factor == -5);
            expect(pb_pp.objective.elements[1].variable_index == idb);
            expect(pb_pp.objective.elements[1].factor == 10);

            expect(pb_pp.objective.qelements.size() == 2u);
            expect(pb_pp.objective.qelements[0].variable_index_a == ida);
            expect(pb_pp.objective.qelements[0].variable_index_b == idb);
            expect(pb_pp.objective.qelements[0].factor == 1);
            expect(pb_pp.objective.qelements[1].variable_index_a == idc);
            expect(pb_pp.objective.qelements[1].variable_index_b == idd);
            expect(pb_pp.objective.qelements[1].factor == 3);
        }

        {
            const char* str_pb = "minimize\n"
                                 "-5a + [ 2a * b + 6c * d ] /2 + 10b\n"
                                 "Subject to:\n"
                                 "- a + b >= 0\n"
                                 "b + c - d >= 0\n"
                                 "Binaries\n"
                                 "a b c d\n"
                                 "End\n";

            std::istringstream iss(str_pb);
            auto pb = baryonyx::make_problem(*ctx, iss);
            expect(pb);

            auto pb_pp = baryonyx::preprocess(*ctx, pb);

            expect(pb_pp.vars.names.size() == 4u);
            expect(pb_pp.affected_vars.names.size() == 0u);
            expect(pb_pp.equal_constraints.size() == 0u);
            expect(pb_pp.less_constraints.size() == 0u);
            expect(pb_pp.greater_constraints.size() == 2u);

            auto ida = get_variable(pb.vars.names, "a");
            auto idb = get_variable(pb.vars.names, "b");
            auto idc = get_variable(pb.vars.names, "c");
            auto idd = get_variable(pb.vars.names, "d");

            expect(ida >= 0 && ida < baryonyx::length(pb.vars.names));
            expect(idb >= 0 && idb < baryonyx::length(pb.vars.names));
            expect(idc >= 0 && idc < baryonyx::length(pb.vars.names));
            expect(idd >= 0 && idd < baryonyx::length(pb.vars.names));

            expect(pb_pp.objective.elements.size() == 2u);
            expect(pb_pp.objective.elements[0].variable_index == ida);
            expect(pb_pp.objective.elements[0].factor == -5);
            expect(pb_pp.objective.elements[1].variable_index == idb);
            expect(pb_pp.objective.elements[1].factor == 10);

            expect(pb_pp.objective.qelements.size() == 2u);
            expect(pb_pp.objective.qelements[0].variable_index_a == ida);
            expect(pb_pp.objective.qelements[0].variable_index_b == idb);
            expect(pb_pp.objective.qelements[0].factor == 1);
            expect(pb_pp.objective.qelements[1].variable_index_a == idc);
            expect(pb_pp.objective.qelements[1].variable_index_b == idd);
            expect(pb_pp.objective.qelements[1].factor == 3);
        }

        {
            const char* str_pb =
              "minimize\n"
              "-5a + 10a + [ 2a * b + 6c * d ] /2 + 10b - b -b "
              "-b + [2 a * b + 6 c * d] / 2\n"
              "Subject to:\n"
              "- a + b >= 0\n"
              "b + c - d >= 0\n"
              "Binaries\n"
              "a b c d\n"
              "End\n";

            std::istringstream iss(str_pb);
            auto pb = baryonyx::make_problem(*ctx, iss);
            expect(pb);

            auto pb_pp = baryonyx::preprocess(*ctx, pb);

            expect(pb_pp.vars.names.size() == 4u);
            expect(pb_pp.affected_vars.names.size() == 0u);
            expect(pb_pp.equal_constraints.size() == 0u);
            expect(pb_pp.less_constraints.size() == 0u);
            expect(pb_pp.greater_constraints.size() == 2u);

            auto ida = get_variable(pb.vars.names, "a");
            auto idb = get_variable(pb.vars.names, "b");
            auto idc = get_variable(pb.vars.names, "c");
            auto idd = get_variable(pb.vars.names, "d");

            expect(ida >= 0 && ida < baryonyx::length(pb.vars.names));
            expect(idb >= 0 && idb < baryonyx::length(pb.vars.names));
            expect(idc >= 0 && idc < baryonyx::length(pb.vars.names));
            expect(idd >= 0 && idd < baryonyx::length(pb.vars.names));

            expect(pb_pp.objective.elements.size() == 2u);
            expect(pb_pp.objective.elements[0].variable_index == ida);
            expect(pb_pp.objective.elements[0].factor == 5);
            expect(pb_pp.objective.elements[1].variable_index == idb);
            expect(pb_pp.objective.elements[1].factor == 7);

            expect(pb_pp.objective.qelements.size() == 2u);
            expect(pb_pp.objective.qelements[0].variable_index_a == ida);
            expect(pb_pp.objective.qelements[0].variable_index_b == idb);
            expect(pb_pp.objective.qelements[0].factor == 2);
            expect(pb_pp.objective.qelements[1].variable_index_a == idc);
            expect(pb_pp.objective.qelements[1].variable_index_b == idd);
            expect(pb_pp.objective.qelements[1].factor == 6);
        }
    };

    "test_bound_affectation"_test = [] {
        auto ctx = baryonyx::make_context(4);

        auto pb = baryonyx::make_problem(ctx, EXAMPLES_DIR "/bound.lp");

        expect(pb);
        expect(pb.vars.names.size() == static_cast<size_t>(6));

        // The preprocessing can not remove any constraint or variable from the
        // raw_problem.

        auto pb_pp = baryonyx::preprocess(*ctx, pb);
        expect(pb_pp.vars.names.size() == static_cast<size_t>(6));
        expect(pb_pp.affected_vars.names.size() == static_cast<size_t>(0));
        expect(pb_pp.equal_constraints.size() == static_cast<size_t>(0));
        expect(pb_pp.less_constraints.size() == static_cast<size_t>(2));
        expect(pb_pp.greater_constraints.size() == static_cast<size_t>(0));

        // We add an "affectation bound" for the variable 'f' i.e. in bound
        // section of the lp file format:
        //
        // bounds:
        // f = 0

        auto id = get_variable(pb.vars.names, "f");
        expect(id >= 0);
        expect(id < baryonyx::length(pb.vars.names));

        expect(pb.vars.names.size() == pb.vars.values.size());

        pb.vars.values[id].min = 0;
        pb.vars.values[id].max = 0;

        auto pb_pp2 = baryonyx::preprocess(*ctx, pb);
        expect(pb_pp2.vars.names.size() == static_cast<size_t>(5));
        expect(pb_pp2.affected_vars.names.size() == static_cast<size_t>(1));
        expect(pb_pp2.equal_constraints.size() == static_cast<size_t>(0));
        expect(pb_pp2.less_constraints.size() == static_cast<size_t>(2));
        expect(pb_pp2.greater_constraints.size() == static_cast<size_t>(0));
    };

    "test_cleaning_affected_variables"_test = [] {
        auto ctx = baryonyx::make_context(4);
        auto pb = baryonyx::make_problem(ctx, EXAMPLES_DIR "/prepro.lp");

        expect(pb);
        expect(pb.vars.names.size() == static_cast<size_t>(23));

        auto pb_pp = baryonyx::preprocess(*ctx, pb);

        expect(pb_pp.vars.names.size() == static_cast<size_t>(2));
        expect(pb_pp.affected_vars.names.size() == static_cast<size_t>(21));
    };

    "test_affect_variable"_test = [] {
        auto ctx = baryonyx::make_context(4);
        auto pb = baryonyx::make_problem(ctx, EXAMPLES_DIR "/prepro.lp");

        expect(pb);
        auto pb_pp = baryonyx::preprocess(*ctx, pb);

        expect(pb_pp.vars.names.size() == static_cast<size_t>(2));
        expect(pb_pp.affected_vars.names.size() == static_cast<size_t>(21));

        {
            // + d + e <= 1
            // d = 1 implies e = 0

            auto pb_af = baryonyx::affect(*ctx, pb_pp, 0, true);
            expect(pb_af.vars.names.size() == static_cast<size_t>(0));
            expect(pb_af.affected_vars.names.size() ==
                   static_cast<size_t>(23));
        }

        {
            // + d + e <= 1
            // d = 0 implies e = {0, 1} but minimize so => 0.

            auto pb_af = baryonyx::affect(*ctx, pb_pp, 0, false);
            expect(pb_af.vars.names.size() == static_cast<size_t>(0));
            expect(pb_af.affected_vars.names.size() ==
                   static_cast<size_t>(23));
        }

        {
            // + d + e <= 1
            // e = 1 implies d = 0

            auto pb_af = baryonyx::affect(*ctx, pb_pp, 1, true);
            expect(pb_af.vars.names.size() == static_cast<size_t>(0));
            expect(pb_af.affected_vars.names.size() ==
                   static_cast<size_t>(23));
        }

        {
            // + d + e <= 1
            // e = 0 implies d = {0, 1} but minimize so => 0.

            auto pb_af = baryonyx::affect(*ctx, pb_pp, 1, false);
            expect(pb_af.vars.names.size() == static_cast<size_t>(0));
            expect(pb_af.affected_vars.names.size() ==
                   static_cast<size_t>(23));
        }
    };

    "test_split"_test = [] {
        auto ctx = baryonyx::make_context(4);
        auto pb = baryonyx::make_problem(ctx, EXAMPLES_DIR "/prepro.lp");
        expect(pb);
        auto pb_pp = baryonyx::preprocess(*ctx, pb);

        expect(pb_pp.vars.names.size() == static_cast<size_t>(2));
        expect(pb_pp.affected_vars.names.size() == static_cast<size_t>(21));

        baryonyx::problem p0, p1;
        std::tie(p0, p1) = baryonyx::split(*ctx, pb_pp, 0);

        {
            // + d + e <= 1
            // d = 1 implies e = 0

            expect(p0.vars.names.size() == static_cast<size_t>(0));
            expect(p0.affected_vars.names.size() == static_cast<size_t>(23));
        }

        {
            // + d + e <= 1
            // d = 0 implies e = {0, 1}

            expect(p1.vars.names.size() == static_cast<size_t>(0));
            expect(p1.affected_vars.names.size() == static_cast<size_t>(23));
        }
    };
}